

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall tinyusdz::MetaVariable::~MetaVariable(MetaVariable *this)

{
  MetaVariable *this_local;
  
  ::std::__cxx11::string::~string((string *)&this->_name);
  tinyusdz::value::Value::~Value(&this->_value);
  return;
}

Assistant:

MetaVariable &operator=(const MetaVariable &rhs) {
    _name = rhs._name;
    _value = rhs._value;

    return *this;
  }